

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  IfcAnnotationFillAreaOccurrence *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xc8,"IfcAnnotationFillAreaOccurrence");
  IfcAnnotationOccurrence::IfcAnnotationOccurrence
            ((IfcAnnotationOccurrence *)this,&PTR_construction_vtable_24__01003ef8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>::ObjectHelper
            (&this->
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>,
             &PTR_construction_vtable_24__01003f70);
  *(undefined8 *)this = 0x1003e40;
  *(undefined8 *)&this->field_0xc8 = 0x1003ee0;
  *(undefined8 *)&this->field_0x10 = 0x1003e68;
  *(undefined8 *)&this->field_0x70 = 0x1003e90;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x1003eb8;
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPoint>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPoint>_> *)
             &(this->
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
              field_0x10);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
         field_0x20);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}